

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timMan.c
# Opt level: O0

void Tim_ManBlackBoxIoNum(Tim_Man_t *p,int *pnBbIns,int *pnBbOuts)

{
  int iVar1;
  void *pvVar2;
  int local_2c;
  int i;
  Tim_Box_t *pBox;
  int *pnBbOuts_local;
  int *pnBbIns_local;
  Tim_Man_t *p_local;
  
  *pnBbOuts = 0;
  *pnBbIns = 0;
  iVar1 = Tim_ManBoxNum(p);
  if (iVar1 != 0) {
    for (local_2c = 0; iVar1 = Vec_PtrSize(p->vBoxes), local_2c < iVar1; local_2c = local_2c + 1) {
      pvVar2 = Vec_PtrEntry(p->vBoxes,local_2c);
      if (*(int *)((long)pvVar2 + 0x18) != 0) {
        iVar1 = Tim_ManBoxInputNum(p,local_2c);
        *pnBbIns = iVar1 + *pnBbIns;
        iVar1 = Tim_ManBoxOutputNum(p,local_2c);
        *pnBbOuts = iVar1 + *pnBbOuts;
      }
    }
  }
  return;
}

Assistant:

void Tim_ManBlackBoxIoNum( Tim_Man_t * p, int * pnBbIns, int * pnBbOuts )
{
    Tim_Box_t * pBox;
    int i;
    *pnBbIns = *pnBbOuts = 0;
    if ( Tim_ManBoxNum(p) )
        Tim_ManForEachBox( p, pBox, i )
        {
            if ( !pBox->fBlack )//&& pBox->nInputs <= 6 )
                continue;
            *pnBbIns  += Tim_ManBoxInputNum( p, i );
            *pnBbOuts += Tim_ManBoxOutputNum( p, i );
        }
}